

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

DoubleParameter * __thiscall CoreML::Specification::AdamOptimizer::mutable_eps(AdamOptimizer *this)

{
  DoubleParameter *this_00;
  
  this_00 = this->eps_;
  if (this_00 == (DoubleParameter *)0x0) {
    this_00 = (DoubleParameter *)operator_new(0x28);
    DoubleParameter::DoubleParameter(this_00);
    this->eps_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::DoubleParameter* AdamOptimizer::mutable_eps() {
  
  if (eps_ == NULL) {
    eps_ = new ::CoreML::Specification::DoubleParameter;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.AdamOptimizer.eps)
  return eps_;
}